

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

ostream * operator<<(ostream *s,Matrix *m)

{
  ostream *poVar1;
  ostream *poVar2;
  size_t in_RCX;
  uint uVar3;
  int i;
  long lVar4;
  Matrix local_120;
  
  if (m->nMatrixDimension == 0) {
    poVar2 = std::ostream::_M_insert<double>(*m->pData);
  }
  else {
    poVar2 = s;
    if (m->nMatrixDimension == 1) {
      for (lVar4 = 0; lVar4 < *m->pSize; lVar4 = lVar4 + 1) {
        poVar1 = std::ostream::_M_insert<double>(m->pData[lVar4]);
        std::operator<<(poVar1,' ');
      }
    }
    else {
      for (uVar3 = 0; (int)uVar3 < *m->pSize; uVar3 = uVar3 + 1) {
        Matrix::read(&local_120,(int)m,(void *)(ulong)uVar3,in_RCX);
        operator<<(s,&local_120);
        Matrix::~Matrix(&local_120);
      }
    }
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  return s;
}

Assistant:

ostream& operator<<(ostream& s, const Matrix& m)
{	
	switch( m.nMatrixDimension ) {
	case 0:
		s  << m.pData[0] << endl;
		break;
	case 1:
		for( int i=0; i<m.pSize[0]; i++ )
			s << m.pData[i] << ' ';
		s << endl;
		break;
	default:
		// start recursion
		for(int i=0; i<m.pSize[0]; i++) 
			s << m.read(i);
		s << endl;			
		break;
	}
	return s;
}